

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Reader brand;
  undefined8 *puVar5;
  CapTableReader *pCVar6;
  BrandScope *pBVar7;
  undefined4 uVar8;
  byte *pbVar9;
  _func_int *p_Var10;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar11;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> p;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_268;
  undefined1 local_1b8 [8];
  CapTableReader *pCStack_1b0;
  anon_union_96_2_a774ebf0_for_OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_3
  local_1a8;
  undefined4 local_148;
  undefined4 uStack_144;
  BrandScope *pBStack_140;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  ErrorReporter *local_f8;
  Disposer *pDStack_f0;
  BrandScope *local_e8;
  uint64_t uStack_e0;
  undefined8 local_d8;
  BrandedDecl *pBStack_d0;
  void *local_c8;
  ArrayDisposer *pAStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  byte local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ListReader local_60;
  
  if (result->tag == 1) {
    pop((BrandScope *)&local_268,(uint64_t)this);
    uVar3 = local_268.field_1._0_8_;
    local_a0 = (result->field_1).space[0x28];
    pbVar9 = (byte *)0x0;
    if (local_a0 != '\0') {
      pbVar9 = (result->field_1).space + 0x30;
    }
    if (local_a0 == '\x01') {
      local_c8 = (result->field_1).forceAligned;
      pAStack_c0 = *(ArrayDisposer **)((long)&result->field_1 + 8);
      local_b8 = *(undefined8 *)((long)&result->field_1 + 0x10);
      uStack_b0 = *(undefined8 *)((long)&result->field_1 + 0x18);
      local_a8 = *(undefined8 *)((long)&result->field_1 + 0x20);
      local_98 = *(undefined8 *)((long)&result->field_1 + 0x30);
      uStack_90 = *(undefined8 *)((long)&result->field_1 + 0x38);
      local_88 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uStack_80 = *(undefined8 *)((long)&result->field_1 + 0x48);
      local_78 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uStack_70 = *(undefined8 *)((long)&result->field_1 + 0x58);
      if (*(short *)(pbVar9 + 0x24) == 0) {
        uVar8 = 0x7fffffff;
        pCStack_1b0 = (CapTableReader *)0x0;
        local_1a8.forceAligned = (void *)0x0;
        local_1b8 = (undefined1  [8])0x0;
      }
      else {
        local_1b8 = *(undefined1 (*) [8])pbVar9;
        pCStack_1b0 = *(CapTableReader **)(pbVar9 + 8);
        local_1a8.forceAligned = (void *)*(undefined8 *)(pbVar9 + 0x18);
        uVar8 = *(undefined4 *)(pbVar9 + 0x28);
      }
      local_1a8._8_4_ = uVar8;
      _::PointerReader::getList(&local_60,(PointerReader *)local_1b8,INLINE_COMPOSITE,(word *)0x0);
      brand.reader.capTable = local_60.capTable;
      brand.reader.segment = local_60.segment;
      brand.reader.ptr = local_60.ptr;
      brand.reader.elementCount = local_60.elementCount;
      brand.reader.step = local_60.step;
      brand.reader.structDataSize = local_60.structDataSize;
      brand.reader.structPointerCount = local_60.structPointerCount;
      brand.reader.elementSize = local_60.elementSize;
      brand.reader._39_1_ = local_60._39_1_;
      brand.reader.nestingLimit = local_60.nestingLimit;
      brand.reader._44_4_ = local_60._44_4_;
      OVar11 = evaluateBrand((BrandScope *)local_108,(Resolver *)uVar3,(ResolvedDecl *)resolver,
                             brand,(uint)&local_c8);
      puVar5 = (undefined8 *)CONCAT44(local_268._4_4_,local_268._0_4_);
      local_268._0_4_ = local_108._0_4_;
      local_268._4_4_ = local_108._4_4_;
      uVar3 = uStack_100;
      uStack_100._0_4_ = 0;
      uStack_100._4_4_ = 0;
      if ((Resolver *)local_268.field_1._0_8_ != (Resolver *)0x0) {
        p_Var10 = (*(_func_int ***)local_268.field_1._0_8_)[-2] + local_268.field_1._0_8_;
        local_268.field_1._0_8_ = uVar3;
        (**(code **)*puVar5)(puVar5,p_Var10,OVar11.ptr);
        uVar3 = local_268.field_1._0_8_;
      }
    }
    else {
      OVar11 = push((BrandScope *)local_1b8,local_268.field_1._0_8_,
                    (uint)*(undefined8 *)&result->field_1);
      puVar5 = (undefined8 *)CONCAT44(local_268._4_4_,local_268._0_4_);
      local_268._0_4_ = local_1b8._0_4_;
      local_268._4_4_ = local_1b8._4_4_;
      uVar3 = pCStack_1b0;
      pCStack_1b0 = (CapTableReader *)0x0;
      if ((Resolver *)local_268.field_1._0_8_ != (Resolver *)0x0) {
        p_Var10 = (*(_func_int ***)local_268.field_1._0_8_)[-2] + local_268.field_1._0_8_;
        local_268.field_1._0_8_ = uVar3;
        (**(code **)*puVar5)(puVar5,p_Var10,OVar11.ptr);
        uVar3 = local_268.field_1._0_8_;
      }
      local_268.field_1._0_8_ = uVar3;
      pCVar6 = pCStack_1b0;
      uVar3 = local_268.field_1._0_8_;
      if (pCStack_1b0 != (CapTableReader *)0x0) {
        pCStack_1b0 = (CapTableReader *)0x0;
        (**(code **)*(_func_int **)local_1b8)
                  (local_1b8,pCVar6->_vptr_CapTableReader[-2] + (long)&pCVar6->_vptr_CapTableReader)
        ;
        uVar3 = local_268.field_1._0_8_;
      }
    }
    local_268.field_1._0_8_ = uVar3;
    bVar1 = (result->field_1).space[0x28];
    if (bVar1 == '\x01') {
      local_f8 = *(ErrorReporter **)((long)&result->field_1 + 0x30);
      pDStack_f0 = *(Disposer **)((long)&result->field_1 + 0x38);
      local_e8 = *(BrandScope **)((long)&result->field_1 + 0x40);
      uStack_e0 = *(uint64_t *)((long)&result->field_1 + 0x48);
      local_d8 = *(undefined8 *)((long)&result->field_1 + 0x50);
      pBStack_d0 = *(BrandedDecl **)((long)&result->field_1 + 0x58);
    }
    (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
    (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
    (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
    *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
    (__return_storage_ptr__->source)._reader.data = source._reader.data;
    (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
    (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
    (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
    (__return_storage_ptr__->body).tag = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)CONCAT44(local_268._4_4_,local_268._0_4_)
    ;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_268.field_1._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) =
         *(undefined8 *)((long)&result->field_1 + 0x20);
    pvVar2 = (result->field_1).forceAligned;
    uVar3 = *(undefined8 *)((long)&result->field_1 + 8);
    uVar4 = *(undefined8 *)((long)&result->field_1 + 0x18);
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) =
         *(undefined8 *)((long)&result->field_1 + 0x10);
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uVar4;
    (__return_storage_ptr__->body).field_1.forceAligned = pvVar2;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar3;
    (__return_storage_ptr__->body).field_1.space[0x28] = bVar1;
    if (bVar1 != '\0') {
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = local_d8;
      *(BrandedDecl **)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = pBStack_d0;
      *(BrandScope **)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = local_e8;
      *(uint64_t *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = uStack_e0;
      *(ErrorReporter **)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = local_f8;
      *(Disposer **)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = pDStack_f0;
    }
    (__return_storage_ptr__->body).tag = 1;
  }
  else {
    lookupParameter((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_268,this,resolver,
                    (uint64_t)(result->field_1).forceAligned,*(uint *)((long)&result->field_1 + 8));
    local_1b8[0] = local_268.isSet;
    if (local_268.isSet == true) {
      pCStack_1b0 = (CapTableReader *)CONCAT44(pCStack_1b0._4_4_,local_268.field_1.value.body.tag);
      if (local_268.field_1.value.body.tag == 2) {
        local_1a8.forceAligned = (void *)local_268.field_1._8_8_;
        local_1a8._8_8_ = local_268.field_1._16_8_;
      }
      else if (local_268.field_1.value.body.tag == 1) {
        local_1a8._32_8_ = local_268.field_1._40_8_;
        local_1a8._16_8_ = local_268.field_1._24_8_;
        local_1a8._24_8_ = local_268.field_1._32_8_;
        local_1a8.forceAligned = (void *)local_268.field_1._8_8_;
        local_1a8._8_8_ = local_268.field_1._16_8_;
        local_1a8.space[0x28] = local_268.field_1._48_1_;
        if (local_268.field_1._48_1_ == '\x01') {
          local_1a8._80_8_ = local_268.field_1._88_8_;
          local_1a8._88_8_ = local_268.field_1._96_8_;
          local_1a8._64_8_ = local_268.field_1._72_8_;
          local_1a8._72_8_ = local_268.field_1._80_8_;
          local_1a8._48_8_ = local_268.field_1._56_8_;
          local_1a8._56_8_ = local_268.field_1._64_8_;
        }
      }
      pBStack_140 = local_268.field_1.value.brand.ptr;
      uStack_144 = local_268.field_1._108_4_;
      local_148 = local_268.field_1._104_4_;
      local_268.field_1.value.brand.ptr = (BrandScope *)0x0;
      if (local_268.field_1.value.body.tag == 1) {
        local_268.field_1._0_8_ = local_268.field_1._0_8_ & 0xffffffff00000000;
      }
      if (local_268.field_1.value.body.tag == 2) {
        local_268.field_1._0_8_ = local_268.field_1._0_8_ & 0xffffffff00000000;
      }
    }
    if (local_268.isSet == true) {
      BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)&pCStack_1b0);
    }
    else {
      pvVar2 = (result->field_1).forceAligned;
      uVar8 = *(undefined4 *)((long)&result->field_1 + 8);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
      (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
      (__return_storage_ptr__->body).field_1.forceAligned = pvVar2;
      *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar8;
      (__return_storage_ptr__->body).tag = 2;
    }
    pBVar7 = pBStack_140;
    if ((local_1b8[0] == '\x01') && (pBStack_140 != (BrandScope *)0x0)) {
      pBStack_140 = (BrandScope *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_144,local_148))
                ((undefined8 *)CONCAT44(uStack_144,local_148),
                 (pBVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar7->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_MAYBE(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand->getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }